

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O2

MessageBuilder * __thiscall tcu::MessageBuilder::operator<<(MessageBuilder *this,VarValue *value)

{
  ostringstream *this_00;
  float fVar1;
  DataType dataType;
  DataType DVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  Hex<8UL> hex;
  ulong uVar6;
  ulong uVar7;
  
  this_00 = &this->m_str;
  dataType = (value->type->m_data).basic.type;
  DVar2 = glu::getDataTypeScalarType(dataType);
  uVar3 = glu::getDataTypeScalarSize(dataType);
  if (1 < (int)uVar3) {
    pcVar4 = glu::getDataTypeName(dataType);
    poVar5 = std::operator<<((ostream *)this_00,pcVar4);
    std::operator<<(poVar5,"(");
  }
  uVar7 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  do {
    if (uVar6 == uVar7) {
      if (1 < (int)uVar3) {
        std::operator<<((ostream *)this_00,")");
      }
      return this;
    }
    if (uVar7 != 0) {
      std::operator<<((ostream *)this_00,", ");
    }
    if (DVar2 == TYPE_BOOL) {
      pcVar4 = "true";
      if (*(int *)((long)value->value + uVar7 * 4) == 0) {
        pcVar4 = "false";
      }
      std::operator<<((ostream *)this_00,pcVar4);
    }
    else if (DVar2 == TYPE_INT) {
      std::ostream::operator<<(this_00,*(int *)((long)value->value + uVar7 * 4));
    }
    else {
      if (DVar2 == TYPE_UINT) {
        fVar1 = *(float *)((long)value->value + uVar7 * 4);
        poVar5 = (ostream *)this_00;
      }
      else {
        if (DVar2 != TYPE_FLOAT) goto LAB_00788206;
        fVar1 = *(float *)((long)value->value + uVar7 * 4);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,fVar1);
        poVar5 = std::operator<<(poVar5," / ");
      }
      hex.value._4_4_ = 0;
      hex.value._0_4_ = fVar1;
      Format::operator<<(poVar5,hex);
    }
LAB_00788206:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

inline MessageBuilder& MessageBuilder::operator<< (const T& value)
{
	// Overload stream operator to implement custom format
	m_str << value;
	return *this;
}